

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::setKernelArg
          (CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg_value,size_t arg_size)

{
  mapped_type pvVar1;
  bool bVar2;
  mapped_type *ppvVar3;
  mapped_type *__k;
  allocator_type *__a;
  mapped_type_conflict *pmVar4;
  undefined8 *in_RCX;
  mapped_type_conflict in_R8;
  CArgLocalSizeMap *argMap;
  uint8_t *pRawArgData;
  CArgDataMap *argDataMap;
  CArgSamplerMap *argSamplerMap;
  string samplerString;
  CArgMemMap *argMemMap;
  cl_mem mem;
  lock_guard<std::mutex> lock;
  map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
  *in_stack_fffffffffffffea8;
  lock_guard<std::mutex> *in_stack_fffffffffffffeb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  CLIntercept *in_stack_fffffffffffffee0;
  uchar *__last;
  key_type *in_stack_fffffffffffffee8;
  mapped_type *in_stack_fffffffffffffef0;
  uchar local_b9 [25];
  undefined8 *local_a0;
  mapped_type *local_98;
  mapped_type *local_90;
  string local_88 [32];
  mapped_type *local_68;
  _Self local_60 [3];
  mapped_type local_48;
  _Self local_40;
  mapped_type local_38;
  mapped_type_conflict local_28;
  undefined8 *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffeb0,(mutex_type *)in_stack_fffffffffffffea8);
  if (local_20 == (undefined8 *)0x0) {
    std::
    map<_cl_kernel_*,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>_>_>_>
    ::operator[]((map<_cl_kernel_*,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>_>_>_>
                  *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    pmVar4 = std::
             map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::operator[]((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                           *)in_stack_fffffffffffffef0,
                          (key_type_conflict1 *)in_stack_fffffffffffffee8);
    *pmVar4 = local_28;
  }
  else {
    if (local_28 == 8) {
      local_48 = (mapped_type)*local_20;
      local_38 = local_48;
      local_40._M_node =
           (_Base_ptr)
           std::
           map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
           ::find(in_stack_fffffffffffffea8,(key_type *)0x20b8ac);
      local_60[0]._M_node =
           (_Base_ptr)
           std::
           map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
           ::end(in_stack_fffffffffffffea8);
      bVar2 = std::operator!=(&local_40,local_60);
      if (bVar2) {
        local_68 = std::
                   map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                   ::operator[]((map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                                 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        pvVar1 = local_38;
        ppvVar3 = std::
                  map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                  ::operator[]((map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                                *)in_stack_fffffffffffffef0,
                               (key_type_conflict1 *)in_stack_fffffffffffffee8);
        *ppvVar3 = pvVar1;
      }
    }
    std::__cxx11::string::string(local_88);
    bVar2 = checkGetSamplerString
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                       ,in_stack_fffffffffffffec8);
    if (bVar2) {
      local_90 = std::
                 map<_cl_kernel_*,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator[]((map<_cl_kernel_*,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                               *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      in_stack_fffffffffffffef0 =
           std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffef0,(key_type_conflict1 *)in_stack_fffffffffffffee8
                       );
      std::__cxx11::string::operator=((string *)in_stack_fffffffffffffef0,local_88);
    }
    __k = std::
          map<_cl_kernel_*,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
          ::operator[]((map<_cl_kernel_*,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_a0 = local_20;
    __a = (allocator_type *)((long)local_20 + local_28);
    __last = local_b9;
    local_98 = __k;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x20bab1);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef0,
               (uchar *)__k,__last,__a);
    std::
    map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator[]((map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_fffffffffffffef0,(key_type_conflict1 *)__k);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffec0);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x20bb17);
    std::__cxx11::string::~string(local_88);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20bbef);
  return;
}

Assistant:

void CLIntercept::setKernelArg(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value,
    size_t arg_size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( arg_value != nullptr )
    {
        if( arg_size == sizeof(cl_mem) )
        {
            cl_mem  mem = ((cl_mem*)arg_value)[0];
            if( m_MemAllocNumberMap.find(mem) != m_MemAllocNumberMap.end() )
            {
                CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
                argMemMap[ arg_index ] = mem;
            }
        }

        std::string samplerString;
        if( checkGetSamplerString( arg_size, arg_value, samplerString) )
        {
            CArgSamplerMap& argSamplerMap = m_KernelArgSamplerMap[kernel];
            argSamplerMap[ arg_index ] = samplerString;
        }

        CArgDataMap& argDataMap = m_KernelArgDataMap[kernel];
        const uint8_t* pRawArgData = reinterpret_cast<const uint8_t*>(arg_value);
        argDataMap[ arg_index ] = std::vector<uint8_t>(
            pRawArgData, pRawArgData + arg_size );
    }
    else
    {
        CArgLocalSizeMap& argMap = m_KernelArgLocalSizeMap[ kernel ];
        argMap[ arg_index ] = arg_size;
    }
}